

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O3

void __thiscall OpenMD::ChargeDensityZ::generateXYZForLastFrame(ChargeDensityZ *this)

{
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *this_00;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *this_01;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *this_02;
  char cVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  _Rb_tree_header *p_Var5;
  mapped_type *pmVar6;
  mapped_type_conflict *pmVar7;
  long lVar8;
  _Base_ptr p_Var9;
  long *plVar10;
  size_t index;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  int key1;
  int key;
  string a_name;
  string XYZFile;
  string a_name1;
  ofstream rdfStream;
  double local_358;
  _Rb_tree_color local_340;
  _Rb_tree_color local_33c;
  long *local_338;
  size_t local_330;
  long local_328 [2];
  double local_318;
  undefined8 uStack_310;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_300;
  double local_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0 [2];
  long local_2c0 [2];
  double local_2b0;
  _Base_ptr local_2a8;
  double local_2a0;
  double local_298;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_290;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_288;
  _Base_ptr local_280;
  double local_278;
  mapped_type_conflict local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  undefined8 uStack_240;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  getPrefix((string *)local_230,&this->fileName_);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_230);
  local_2f0 = &local_2e0;
  plVar10 = plVar3 + 2;
  if ((long *)*plVar3 == plVar10) {
    local_2e0 = *plVar10;
    lStack_2d8 = plVar3[3];
  }
  else {
    local_2e0 = *plVar10;
    local_2f0 = (long *)*plVar3;
  }
  local_2e8 = plVar3[1];
  *plVar3 = (long)plVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_230,(char *)local_2f0,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"XYZ file: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)local_230,
                        (int)(this->zPosUsingGlobalIndex_)._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_230,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\t",2);
    poVar4 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->x_ * 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->x_][(uint)this->y_]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->x_][(uint)this->axis_]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->y_][(uint)this->x_]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->y_ * 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->y_][(uint)this->axis_]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->axis_][(uint)this->x_]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[(uint)this->axis_][(uint)this->y_]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    poVar4 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(this->hmat_).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->axis_ * 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    p_Var9 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var5) {
      this_00 = &this->zPosUsingGlobalIndex_;
      this_01 = &this->xPosUsingGlobalIndex_;
      this_02 = &this->yPosUsingGlobalIndex_;
      local_300 = &this->totalChargeUsingGlobalIndex_;
      local_288 = &this->vanderRUsingGlobalIndex_;
      local_290 = &this->averageChargeUsingGlobalIndex_;
      do {
        local_33c = p_Var9[1]._M_color;
        local_338 = local_328;
        local_2a8 = p_Var9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,p_Var9[1]._M_parent,
                   (long)&(p_Var9[1]._M_parent)->_M_color + (long)&(p_Var9[1]._M_left)->_M_color);
        pmVar6 = std::
                 map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](this_00,(key_type *)&local_33c);
        local_298 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1];
        pmVar6 = std::
                 map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](this_01,(key_type *)&local_33c);
        local_2a0 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1];
        pmVar6 = std::
                 map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](this_02,(key_type *)&local_33c);
        local_2b0 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1];
        if ((local_330 == (this->atomFlucCharge_)._M_string_length) &&
           ((local_330 == 0 ||
            (iVar2 = bcmp(local_338,(this->atomFlucCharge_)._M_dataplus._M_p,local_330), iVar2 == 0)
            ))) {
          p_Var9 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ;
          if ((_Rb_tree_header *)p_Var9 == p_Var5) {
            local_358 = 0.0;
          }
          else {
            local_358 = 0.0;
            do {
              local_340 = p_Var9[1]._M_color;
              local_2d0[0] = local_2c0;
              local_280 = p_Var9;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2d0,p_Var9[1]._M_parent,
                         (long)&(p_Var9[1]._M_parent)->_M_color +
                         (long)&(p_Var9[1]._M_left)->_M_color);
              pmVar7 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[](local_288,(key_type *)&local_340);
              local_318 = *pmVar7;
              pmVar7 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[](local_290,(key_type *)&local_340);
              local_270 = *pmVar7;
              local_268 = local_318 * local_318 + local_318 * local_318;
              local_2f8 = local_318 * 6.283185307179586 * local_318;
              local_278 = SQRT(local_2f8);
              for (uVar11 = 0;
                  pmVar6 = std::
                           map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                           ::operator[](this_00,(key_type *)&local_340),
                  uVar11 < (ulong)((long)(pmVar6->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pmVar6->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start >> 3);
                  uVar11 = uVar11 + 1) {
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](this_01,(key_type *)&local_33c);
                local_318 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](this_02,(key_type *)&local_33c);
                dVar13 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_33c);
                local_248 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                uStack_240 = 0;
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_340);
                local_250 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](this_01,(key_type *)&local_340);
                local_258 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](this_02,(key_type *)&local_340);
                local_260 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                pmVar6 = std::
                         map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator[](local_300,(key_type *)&local_340);
                dVar14 = local_318 - local_258;
                dVar13 = dVar13 - local_260;
                local_318 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar11];
                uStack_310 = 0;
                dVar14 = exp(-((local_248 - local_250) * (local_248 - local_250) +
                              dVar14 * dVar14 + dVar13 * dVar13) / local_268);
                dVar13 = local_278;
                if (local_2f8 < 0.0) {
                  dVar13 = sqrt(local_2f8);
                }
                local_358 = local_358 +
                            (dVar14 / dVar13) *
                            (double)(-(ulong)(1e-06 < ABS(local_318 - local_270)) &
                                    (ulong)(local_318 - local_270));
              }
              if (local_2d0[0] != local_2c0) {
                operator_delete(local_2d0[0],local_2c0[0] + 1);
              }
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_280);
            } while ((_Rb_tree_header *)p_Var9 != p_Var5);
          }
          lVar8 = (long)this->nProcessed_ *
                  (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar12._0_8_ = lVar8;
          auVar12._12_4_ = 0x45300000;
          local_358 = local_358 /
                      ((auVar12._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
        }
        else {
          pmVar6 = std::
                   map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                   ::operator[](local_300,(key_type *)&local_33c);
          local_358 = (pmVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish[-1];
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,(char *)local_338,local_330);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>(local_298);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>(local_2a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>(local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>(local_358);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if (local_338 != local_328) {
          operator_delete(local_338,local_328[0] + 1);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_2a8);
      } while ((_Rb_tree_header *)p_Var9 != p_Var5);
    }
  }
  std::ofstream::close();
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  return;
}

Assistant:

void ChargeDensityZ::generateXYZForLastFrame() {
    std::string XYZFile(getPrefix(fileName_) + ".xyz");
    std::ofstream rdfStream(XYZFile.c_str());
    int nAtoms = zPosUsingGlobalIndex_.size();

    if (rdfStream.is_open()) {
      rdfStream << nAtoms << "\n";
      rdfStream << 1 << ";\t" << hmat_(x_, x_) << "\t" << hmat_(x_, y_) << "\t"
                << hmat_(x_, axis_) << "\t" << hmat_(y_, x_) << "\t"
                << hmat_(y_, y_) << "\t" << hmat_(y_, axis_) << "\t"
                << hmat_(axis_, x_) << "\t" << hmat_(axis_, y_) << "\t"
                << hmat_(axis_, axis_) << "\n";

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int key            = it->first;
        std::string a_name = it->second;
        RealType x         = zPosUsingGlobalIndex_[key].back();
        RealType y         = xPosUsingGlobalIndex_[key].back();
        RealType z         = yPosUsingGlobalIndex_[key].back();
        RealType charge    = 0;

        if (a_name == atomFlucCharge_) {
          for (std::map<int, std::string>::iterator it1 =
                   atomNameGlobalIndex_.begin();
               it1 != atomNameGlobalIndex_.end(); ++it1) {
            int key1            = it1->first;
            std::string a_name1 = it1->second;

            RealType v_radius      = vanderRUsingGlobalIndex_[key1];
            RealType v_radius2     = v_radius * v_radius;
            RealType averageCharge = averageChargeUsingGlobalIndex_[key1];

            for (size_t index = 0; index < zPosUsingGlobalIndex_[key1].size();
                 ++index) {
              RealType xt = xPosUsingGlobalIndex_[key][index];
              RealType yt = yPosUsingGlobalIndex_[key][index];
              RealType zt = zPosUsingGlobalIndex_[key][index];

              RealType z_pos = zPosUsingGlobalIndex_[key1][index];
              RealType x_pos = xPosUsingGlobalIndex_[key1][index];
              RealType y_pos = yPosUsingGlobalIndex_[key1][index];
              RealType r2    = (xt - x_pos) * (xt - x_pos) +
                            (yt - y_pos) * (yt - y_pos) +
                            (zt - z_pos) * (zt - z_pos);

              RealType charge_for_atom =
                  totalChargeUsingGlobalIndex_[key1][index];
              RealType chargeDiff =
                  fabs(charge_for_atom - averageCharge) > epsilon ?
                      charge_for_atom - averageCharge :
                      0;
              RealType gaussian_scale =
                  exp(-r2 / (v_radius2 * 2.0)) /
                  (sqrt(2 * Constants::PI * v_radius * v_radius));
              //  RealType gaussian_scale = 2 * (r2 /( v_radius2 * v_radius)) *
              //  exp(-r2/(v_radius2*2.0)) / (sqrt(2*Constants::PI)* v_radius2 *
              //  v_radius);
              charge += chargeDiff * gaussian_scale;
            }
          }
          charge /= (nProcessed_ * atomNameGlobalIndex_.size());

        } else {
          charge = totalChargeUsingGlobalIndex_[key].back();
        }

        rdfStream << a_name << "\t" << x << "\t" << y << "\t" << z << "\t"
                  << charge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "XYZ file: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }